

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void crnlib::
     hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
     ::construct_value_type(value_type *pDst,vec<16U,_float> *k,uint *v)

{
  uint *v_local;
  vec<16U,_float> *k_local;
  value_type *pDst_local;
  
  memcpy(pDst,k,0x40);
  pDst->second = *v;
  return;
}

Assistant:

static inline void construct_value_type(value_type* pDst, const Key& k, const Value& v)
        {
            if (CRNLIB_IS_BITWISE_COPYABLE(Key))
            {
                memcpy(&pDst->first, &k, sizeof(Key));
            }
            else
            {
                scalar_type<Key>::construct(&pDst->first, k);
            }

            if (CRNLIB_IS_BITWISE_COPYABLE(Value))
            {
                memcpy(&pDst->second, &v, sizeof(Value));
            }
            else
            {
                scalar_type<Value>::construct(&pDst->second, v);
            }
        }